

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O0

int32 parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  undefined1 local_138 [8];
  char examplestr [89];
  char helpstr [178];
  uint32 isExample;
  uint32 isHelp;
  char **argv_local;
  int argc_local;
  
  memcpy(examplestr + 0x58,
         "Description: \n(copied from Eric\'s comments)\n * \tCreate a tied-state-to-codebook mapping file for semi-continuous, \n *\tphone dependent or fully continuous Gaussian density tying."
         ,0xb2);
  memcpy(local_138,
         "Example: \n(By Arthur: Not sure, may be obsolete) \nmk_ts2cb -moddeffn semi -ts2cbfn ts2cb"
         ,0x59);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",examplestr + 0x58);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",local_138);
  }
  if (((int)lVar2 == 0) && ((int)lVar3 == 0)) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/parse_cmd_ln.c"
          ,0x7e,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

  const char helpstr[] =
"Description: \n\
(copied from Eric's comments)\n\
 * 	Create a tied-state-to-codebook mapping file for semi-continuous, \n\
 *	phone dependent or fully continuous Gaussian density tying.";

  const char examplestr[]=
"Example: \n\
(By Arthur: Not sure, may be obsolete) \n\
mk_ts2cb -moddeffn semi -ts2cbfn ts2cb";

    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-ts2cbfn",
	  ARG_STRING,
	  NULL,
	  "A SPHINX-III tied-state-to-cb file name" },
	{ "-moddeffn",
	  ARG_STRING,
	  NULL,
	  "A SPHINX-III model definition file name" },
	{ "-tyingtype",			/* either "semi", "pd", or "cont" */
	  ARG_STRING,
	  "semi",
	  "Output a state parameter def file for fully continuous models"},
	{ "-pclassfn",			/* this switch is reference for -tyingtype pd */
	  ARG_STRING,
	  NULL,
	  "A SPHINX-II phone class file name" },
	{ NULL,
	  0,
	  NULL,
	  NULL }
    };

    cmd_ln_parse(defn, argc, argv, TRUE);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }


    return 0;
}